

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinscachepair_tests.cpp
# Opt level: O1

list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
* __thiscall
coinscachepair_tests::CreatePairs_abi_cxx11_
          (list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
           *__return_storage_ptr__,coinscachepair_tests *this,CoinsCachePair *sentinel)

{
  _List_node_base *p_Var1;
  byte bVar2;
  _List_node_base *p_Var3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  int iVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  _List_node_base *local_120;
  _List_node_base *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  lazy_ostream local_f0;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  _List_node_base **local_b0;
  undefined **local_a8;
  undefined1 local_a0;
  undefined1 *local_98;
  _List_node_base ***local_90;
  _List_node_base **local_88;
  undefined **local_80;
  undefined1 local_78;
  undefined1 *local_70;
  _List_node_base ***local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  )._M_impl._M_node._M_size = 0;
  iVar6 = 4;
  do {
    std::__cxx11::
    list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
    ::_M_insert<>(__return_storage_ptr__,(iterator)__return_storage_ptr__);
    p_Var3 = (__return_storage_ptr__->
             super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
             )._M_impl._M_node.super__List_node_base._M_prev;
    p_Var1 = p_Var3 + 1;
    bVar2 = *(byte *)&p_Var3[4]._M_prev;
    if (bVar2 == 0) {
      p_Var3[3]._M_prev = *(_List_node_base **)(this + 0x28);
      p_Var3[4]._M_next = (_List_node_base *)this;
      *(_List_node_base **)(this + 0x28) = p_Var1;
      p_Var3[3]._M_prev[3]._M_next = p_Var1;
    }
    *(byte *)&p_Var3[4]._M_prev = bVar2 | 1;
    local_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_b8 = "";
    local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = &DAT_00000018;
    file.m_begin = (iterator)&local_c0;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d0,msg);
    local_f0.m_empty = false;
    local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_e0 = boost::unit_test::lazy_ostream::inst;
    local_d8 = "";
    local_120 = (_List_node_base *)CONCAT71(local_120._1_7_,*(char *)&p_Var3[4]._M_prev);
    local_118 = (_List_node_base *)CONCAT44(local_118._4_4_,1);
    local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(*(char *)&p_Var3[4]._M_prev == '\x01');
    local_50.m_message.px = (element_type *)0x0;
    local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_58 = "";
    local_88 = &local_120;
    local_78 = 0;
    local_80 = &PTR__lazy_ostream_013d4aa0;
    local_70 = boost::unit_test::lazy_ostream::inst;
    local_68 = &local_88;
    local_b0 = &local_118;
    local_a0 = 0;
    local_a8 = &PTR__lazy_ostream_013d5380;
    local_98 = boost::unit_test::lazy_ostream::inst;
    local_90 = &local_b0;
    pvVar4 = (iterator)0x1;
    pvVar5 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_50,&local_f0,1,2,REQUIRE,0xe99815,(size_t)&local_60,0x18,&local_80,
               "CCoinsCacheEntry::DIRTY",&local_a8);
    boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
    local_100 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_f8 = "";
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    local_108 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x19;
    file_00.m_begin = (iterator)&local_100;
    msg_00.m_end = pvVar5;
    msg_00.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_110,
               msg_00);
    local_f0.m_empty = false;
    local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_e0 = boost::unit_test::lazy_ostream::inst;
    local_d8 = "";
    local_118 = p_Var3[4]._M_next;
    local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_118 == (_List_node_base *)this);
    local_50.m_message.px = (element_type *)0x0;
    local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_58 = "";
    local_88 = &local_118;
    local_78 = 0;
    local_80 = &PTR__lazy_ostream_013d53c0;
    local_70 = boost::unit_test::lazy_ostream::inst;
    local_68 = &local_88;
    local_b0 = &local_120;
    local_a0 = 0;
    local_a8 = &PTR__lazy_ostream_013d53c0;
    local_98 = boost::unit_test::lazy_ostream::inst;
    local_90 = &local_b0;
    pvVar4 = (iterator)0x1;
    pvVar5 = (iterator)0x2;
    local_120 = (_List_node_base *)this;
    boost::test_tools::tt_detail::report_assertion
              (&local_50,&local_f0,1,2,REQUIRE,0xe99845,(size_t)&local_60,0x19,&local_80,"&sentinel"
               ,&local_a8);
    boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
    local_130 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_128 = "";
    local_140 = &boost::unit_test::basic_cstring<char_const>::null;
    local_138 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x1a;
    file_01.m_begin = (iterator)&local_130;
    msg_01.m_end = pvVar5;
    msg_01.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_140,
               msg_01);
    local_f0.m_empty = false;
    local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_e0 = boost::unit_test::lazy_ostream::inst;
    local_d8 = "";
    local_118 = *(_List_node_base **)(this + 0x28);
    local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_118 == p_Var1);
    local_50.m_message.px = (element_type *)0x0;
    local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_58 = "";
    local_88 = &local_118;
    local_78 = 0;
    local_80 = &PTR__lazy_ostream_013d53c0;
    local_70 = boost::unit_test::lazy_ostream::inst;
    local_68 = &local_88;
    local_b0 = &local_120;
    local_a0 = 0;
    local_a8 = &PTR__lazy_ostream_013d53c0;
    local_98 = boost::unit_test::lazy_ostream::inst;
    local_90 = &local_b0;
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x2;
    local_120 = p_Var1;
    boost::test_tools::tt_detail::report_assertion
              (&local_50,&local_f0,1,2,REQUIRE,0xe99863,(size_t)&local_60,0x1a,&local_80,"&(*node)",
               &local_a8);
    boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
    if (iVar6 != 4) {
      local_150 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
      ;
      local_148 = "";
      local_160 = &boost::unit_test::basic_cstring<char_const>::null;
      local_158 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x1d;
      file_02.m_begin = (iterator)&local_150;
      msg_02.m_end = in_R9;
      msg_02.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_160,
                 msg_02);
      local_f0.m_empty = false;
      local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
      local_e0 = boost::unit_test::lazy_ostream::inst;
      local_d8 = "";
      local_118 = p_Var3->_M_prev[4]._M_next;
      local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(local_118 == p_Var1);
      local_50.m_message.px = (element_type *)0x0;
      local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_60 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
      ;
      local_58 = "";
      local_88 = &local_118;
      local_78 = 0;
      local_80 = &PTR__lazy_ostream_013d53c0;
      local_70 = boost::unit_test::lazy_ostream::inst;
      local_68 = &local_88;
      local_b0 = &local_120;
      local_a0 = 0;
      local_a8 = &PTR__lazy_ostream_013d53c0;
      local_98 = boost::unit_test::lazy_ostream::inst;
      local_90 = &local_b0;
      pvVar4 = (iterator)0x1;
      pvVar5 = (iterator)0x2;
      local_120 = p_Var1;
      boost::test_tools::tt_detail::report_assertion
                (&local_50,&local_f0,1,2,REQUIRE,0xe99883,(size_t)&local_60,0x1d,&local_80,
                 "&(*node)",&local_a8);
      boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
      local_170 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
      ;
      local_168 = "";
      local_180 = &boost::unit_test::basic_cstring<char_const>::null;
      local_178 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x1e;
      file_03.m_begin = (iterator)&local_170;
      msg_03.m_end = pvVar5;
      msg_03.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_180,
                 msg_03);
      local_f0.m_empty = false;
      local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
      local_e0 = boost::unit_test::lazy_ostream::inst;
      local_d8 = "";
      local_118 = p_Var3[3]._M_prev;
      local_120 = p_Var3->_M_prev + 1;
      local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(local_118 == local_120);
      local_50.m_message.px = (element_type *)0x0;
      local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_60 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
      ;
      local_58 = "";
      local_88 = &local_118;
      local_78 = 0;
      local_80 = &PTR__lazy_ostream_013d53c0;
      local_70 = boost::unit_test::lazy_ostream::inst;
      local_68 = &local_88;
      local_b0 = &local_120;
      local_a0 = 0;
      local_a8 = &PTR__lazy_ostream_013d53c0;
      local_98 = boost::unit_test::lazy_ostream::inst;
      local_90 = &local_b0;
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_50,&local_f0,1,2,REQUIRE,0xe998a2,(size_t)&local_60,0x1e,&local_80,
                 "&(*std::prev(node))",&local_a8);
      boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::list<CoinsCachePair> CreatePairs(CoinsCachePair& sentinel)
{
    std::list<CoinsCachePair> nodes;
    for (auto i{0}; i < NUM_NODES; ++i) {
        nodes.emplace_back();

        auto node{std::prev(nodes.end())};
        node->second.AddFlags(CCoinsCacheEntry::DIRTY, *node, sentinel);

        BOOST_CHECK_EQUAL(node->second.GetFlags(), CCoinsCacheEntry::DIRTY);
        BOOST_CHECK_EQUAL(node->second.Next(), &sentinel);
        BOOST_CHECK_EQUAL(sentinel.second.Prev(), &(*node));

        if (i > 0) {
            BOOST_CHECK_EQUAL(std::prev(node)->second.Next(), &(*node));
            BOOST_CHECK_EQUAL(node->second.Prev(), &(*std::prev(node)));
        }
    }
    return nodes;
}